

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datafile.cpp
# Opt level: O3

void __thiscall Datafile::commit(Datafile *this)

{
  Datafile *pDVar1;
  pointer pbVar2;
  pointer pcVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  string *__return_storage_ptr__;
  int __oflag;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t __length;
  Datafile *__filename;
  Datafile *pDVar7;
  pointer pbVar8;
  __string_type __str;
  AtomicFile file;
  string local_80;
  AtomicFile local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->_dirty == true) {
    __filename = this;
    AtomicFile::AtomicFile(&local_60,&this->_file);
    if ((this->_lines).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->_lines).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      AtomicFile::remove(&local_60,(char *)__filename);
    }
    else {
      iVar5 = AtomicFile::open(&local_60,(char *)__filename,__oflag);
      if ((char)iVar5 == '\0') {
        __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,"Could not write to data file {1}","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar3 = (this->_file)._data._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar3,pcVar3 + (this->_file)._data._M_string_length);
        format<std::__cxx11::string>(__return_storage_ptr__,&local_80,&local_50);
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
      pDVar1 = (Datafile *)
               (this->_lines).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pDVar7 = (Datafile *)
               (this->_lines).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __length = extraout_RDX;
      if (pDVar1 != pDVar7) {
        uVar6 = (long)pDVar7 - (long)pDVar1 >> 5;
        lVar4 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (pDVar1,pDVar7,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pDVar1);
        __length = extraout_RDX_00;
        __filename = pDVar7;
      }
      AtomicFile::truncate(&local_60,(char *)__filename,__length);
      pbVar8 = (this->_lines).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (this->_lines).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar8 != pbVar2) {
        do {
          pcVar3 = (pbVar8->_M_dataplus)._M_p;
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_80,pcVar3,pcVar3 + pbVar8->_M_string_length);
          std::__cxx11::string::_M_replace_aux((ulong)&local_80,local_80._M_string_length,0,'\x01');
          AtomicFile::write_raw(&local_60,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 != pbVar2);
      }
      this->_dirty = false;
    }
    AtomicFile::~AtomicFile(&local_60);
  }
  return;
}

Assistant:

void Datafile::commit ()
{
  // The _dirty flag indicates that the file needs to be written.
  if (_dirty)
  {
    AtomicFile file (_file);
    if (! _lines.empty ())
    {
      if (file.open ())
      {
        // Sort the intervals by ascending start time.
        std::sort (_lines.begin (), _lines.end ());

        // Write out all the lines.
        file.truncate ();
        for (auto& line : _lines)
        {
          file.write_raw (line + '\n');
        }

        _dirty = false;
      }
      else
      {
        throw format ("Could not write to data file {1}", _file._data);
      }
    }
    else
    {
      file.remove ();
    }
  }
}